

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlRead(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  bool bVar2;
  long in_RCX;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int nCopy;
  int iSpace;
  sqlite3_int64 iOff;
  FileChunk *pChunk;
  int iChunkOffset;
  int nRead;
  u8 *zOut;
  MemJournal *p;
  long local_70;
  int local_60;
  long local_50;
  undefined8 *local_48;
  int local_40;
  int local_3c;
  void *local_38;
  int local_4;
  
  if (*(long *)(in_RDI + 0x18) < in_EDX + in_RCX) {
    local_4 = 0x20a;
  }
  else {
    if ((*(long *)(in_RDI + 0x28) == in_RCX) && (in_RCX != 0)) {
      local_48 = *(undefined8 **)(in_RDI + 0x30);
    }
    else {
      local_50 = 0;
      local_48 = *(undefined8 **)(in_RDI + 0x10);
      while( true ) {
        bVar2 = false;
        if (local_48 != (undefined8 *)0x0) {
          bVar2 = local_50 + *(int *)(in_RDI + 8) <= in_RCX;
        }
        if (!bVar2) break;
        local_50 = *(int *)(in_RDI + 8) + local_50;
        local_48 = (undefined8 *)*local_48;
      }
    }
    local_40 = (int)(in_RCX % (long)*(int *)(in_RDI + 8));
    local_3c = in_EDX;
    local_38 = in_RSI;
    do {
      iVar1 = *(int *)(in_RDI + 8);
      if (local_3c < *(int *)(in_RDI + 8) - local_40) {
        local_60 = local_3c;
      }
      else {
        local_60 = *(int *)(in_RDI + 8) - local_40;
      }
      memcpy(local_38,(void *)((long)local_48 + (long)local_40 + 8),(long)local_60);
      local_38 = (void *)((long)local_38 + (long)local_60);
      local_3c = local_3c - (iVar1 - local_40);
      local_40 = 0;
      bVar2 = false;
      if (-1 < local_3c) {
        local_48 = (undefined8 *)*local_48;
        bVar2 = false;
        if (local_48 != (undefined8 *)0x0) {
          bVar2 = 0 < local_3c;
        }
      }
    } while (bVar2);
    if (local_48 == (undefined8 *)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = in_RCX + in_EDX;
    }
    *(long *)(in_RDI + 0x28) = local_70;
    *(undefined8 **)(in_RDI + 0x30) = local_48;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int memjrnlRead(
  sqlite3_file *pJfd,    /* The journal file from which to read */
  void *zBuf,            /* Put the results here */
  int iAmt,              /* Number of bytes to read */
  sqlite_int64 iOfst     /* Begin reading at this offset */
){
  MemJournal *p = (MemJournal *)pJfd;
  u8 *zOut = zBuf;
  int nRead = iAmt;
  int iChunkOffset;
  FileChunk *pChunk;

  if( (iAmt+iOfst)>p->endpoint.iOffset ){
    return SQLITE_IOERR_SHORT_READ;
  }
  assert( p->readpoint.iOffset==0 || p->readpoint.pChunk!=0 );
  if( p->readpoint.iOffset!=iOfst || iOfst==0 ){
    sqlite3_int64 iOff = 0;
    for(pChunk=p->pFirst;
        ALWAYS(pChunk) && (iOff+p->nChunkSize)<=iOfst;
        pChunk=pChunk->pNext
    ){
      iOff += p->nChunkSize;
    }
  }else{
    pChunk = p->readpoint.pChunk;
    assert( pChunk!=0 );
  }

  iChunkOffset = (int)(iOfst%p->nChunkSize);
  do {
    int iSpace = p->nChunkSize - iChunkOffset;
    int nCopy = MIN(nRead, (p->nChunkSize - iChunkOffset));
    memcpy(zOut, (u8*)pChunk->zChunk + iChunkOffset, nCopy);
    zOut += nCopy;
    nRead -= iSpace;
    iChunkOffset = 0;
  } while( nRead>=0 && (pChunk=pChunk->pNext)!=0 && nRead>0 );
  p->readpoint.iOffset = pChunk ? iOfst+iAmt : 0;
  p->readpoint.pChunk = pChunk;

  return SQLITE_OK;
}